

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunArrayToElements(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint uVar1;
  VmInstruction *pVVar2;
  VmValue **ppVVar3;
  VmValue *dst;
  TypeBase *type;
  VmInstruction *instruction;
  VmFunction *pVVar4;
  VmConstant *address;
  VmInstruction *pVVar5;
  TypeBase *type_00;
  VmValue *pVVar6;
  VmInstruction *value_00;
  ulong uVar7;
  VmBlock **ppVVar8;
  VmBlock *value_01;
  VmValue *pVVar9;
  uint in_stack_ffffffffffffff88;
  
  if ((value == (VmValue *)0x0) || (pVVar4 = (VmFunction *)value, value->typeID != 4)) {
    pVVar4 = (VmFunction *)0x0;
  }
  if (pVVar4 == (VmFunction *)0x0) {
    if ((value == (VmValue *)0x0) || (value->typeID != 3)) {
      value = (VmValue *)0x0;
    }
    if ((VmBlock *)value == (VmBlock *)0x0) {
      return;
    }
    ppVVar8 = &module->currentBlock;
    module->currentBlock = (VmBlock *)value;
    pVVar2 = ((VmBlock *)value)->firstInstruction;
joined_r0x0028e0ac:
    instruction = pVVar2;
    if (instruction != (VmInstruction *)0x0) {
      pVVar2 = instruction->nextSibling;
      if (instruction->cmd == VM_INST_STORE_STRUCT) {
        uVar1 = (instruction->arguments).count;
        if ((uVar1 != 0) && (uVar1 != 1)) {
          ppVVar3 = (instruction->arguments).data;
          pVVar6 = ppVVar3[1];
          if ((pVVar6 == (VmValue *)0x0) || (pVVar6->typeID != 1)) {
            pVVar6 = (VmValue *)0x0;
          }
          if (2 < uVar1) {
            pVVar9 = ppVVar3[2];
            if ((pVVar9 == (VmValue *)0x0) || (pVVar9->typeID != 2)) {
              pVVar9 = (VmValue *)0x0;
            }
            if (((pVVar9 != (VmValue *)0x0) && (*(int *)&pVVar9[1]._vptr_VmValue == 0x4a)) &&
               ((pVVar9->users).count == 1)) {
              dst = *ppVVar3;
              ((VmBlock *)value)->insertPoint = instruction;
              type_00 = (pVVar9->type).structType;
              if ((type_00 == (TypeBase *)0x0) || (type_00->typeID != 0x13)) {
                type_00 = (TypeBase *)0x0;
              }
              type = (TypeBase *)type_00[1]._vptr_TypeBase;
              address = anon_unknown.dwarf_233176::CreateAlloca
                                  (ctx,module,(instruction->super_VmValue).source,type_00,
                                   "array_elem",true);
              if (pVVar9[1].type.type != VM_TYPE_VOID) {
                uVar7 = 0;
                do {
                  value_00 = *(VmInstruction **)(*(long *)&pVVar9[1].typeID + uVar7 * 8);
                  if ((value_00 == (VmInstruction *)0x0) ||
                     (pVVar5 = value_00, (value_00->super_VmValue).typeID != 2)) {
                    pVVar5 = (VmInstruction *)0x0;
                  }
                  if (pVVar5 == (VmInstruction *)0x0) {
                    in_stack_ffffffffffffff88 = (int)type->size * (int)uVar7;
                    anon_unknown.dwarf_233176::CreateStore
                              (ctx,module,(instruction->super_VmValue).source,type,
                               &address->super_VmValue,&value_00->super_VmValue,
                               in_stack_ffffffffffffff88);
                  }
                  else {
                    if (pVVar5->cmd == VM_INST_DOUBLE_TO_FLOAT) {
                      if ((pVVar5->arguments).count == 0) goto LAB_0028e2d2;
                      value_00 = (VmInstruction *)*(pVVar5->arguments).data;
                    }
                    ((VmBlock *)value)->insertPoint = pVVar5;
                    in_stack_ffffffffffffff88 = (int)type->size * (int)uVar7;
                    anon_unknown.dwarf_233176::CreateStore
                              (ctx,module,(instruction->super_VmValue).source,type,
                               &address->super_VmValue,&value_00->super_VmValue,
                               in_stack_ffffffffffffff88);
                    ((VmBlock *)value)->insertPoint = instruction;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar7 < pVVar9[1].type.type);
              }
              anon_unknown.dwarf_233176::CreateMemCopy
                        (module,(instruction->super_VmValue).source,dst,
                         *(uint *)&pVVar6[1]._vptr_VmValue,&address->super_VmValue,
                         (uint)type_00->size,in_stack_ffffffffffffff88);
              ((VmBlock *)value)->insertPoint = ((VmBlock *)value)->lastInstruction;
              VmBlock::RemoveInstruction((VmBlock *)value,instruction);
            }
            goto joined_r0x0028e0ac;
          }
        }
LAB_0028e2d2:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                     );
      }
      goto joined_r0x0028e0ac;
    }
  }
  else {
    ppVVar8 = (VmBlock **)&module->currentFunction;
    module->currentFunction = pVVar4;
    for (value_01 = pVVar4->firstBlock; value_01 != (VmBlock *)0x0; value_01 = value_01->nextSibling
        ) {
      RunArrayToElements(ctx,module,&value_01->super_VmValue);
    }
  }
  *ppVVar8 = (VmBlock *)0x0;
  return;
}

Assistant:

void RunArrayToElements(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunArrayToElements(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			// If replacement succeeds, we will continue from the same place to handle multi-level arrays
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd == VM_INST_STORE_STRUCT)
			{
				VmValue *storeAddress = curr->arguments[0];
				VmConstant *storeOffset = getType<VmConstant>(curr->arguments[1]);
				VmInstruction *storeValue = getType<VmInstruction>(curr->arguments[2]);

				if(storeValue)
				{
					if(storeValue->cmd == VM_INST_ARRAY && storeValue->users.size() == 1)
					{
						block->insertPoint = curr;

						TypeArray *typeArray = getType<TypeArray>(storeValue->type.structType);

						TypeBase *elementType = typeArray->subType;

						VmConstant *tempAddress = CreateAlloca(ctx, module, curr->source, typeArray, "array_elem", true);

						for(unsigned i = 0; i < storeValue->arguments.size(); i++)
						{
							VmValue *element = storeValue->arguments[i];

							if(VmInstruction *elementInst = getType<VmInstruction>(element))
							{
								if(elementInst->cmd == VM_INST_DOUBLE_TO_FLOAT)
									element = elementInst->arguments[0];

								block->insertPoint = elementInst;

								CreateStore(ctx, module, curr->source, elementType, tempAddress, element, unsigned(elementType->size * i));

								block->insertPoint = curr;
							}
							else
							{
								CreateStore(ctx, module, curr->source, elementType, tempAddress, element, unsigned(elementType->size * i));
							}
						}

						CreateMemCopy(module, curr->source, storeAddress, storeOffset->iValue, tempAddress, 0, int(typeArray->size));

						block->insertPoint = block->lastInstruction;

						block->RemoveInstruction(curr);
					}
				}
			}

			curr = next;
		}

		module->currentBlock = NULL;
	}
}